

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

void os_get_path_name(char *pathbuf,size_t pathbuflen,char *fname)

{
  char *pcVar1;
  char *in_RDX;
  long in_RSI;
  void *in_RDI;
  bool bVar2;
  char *q;
  int root_path;
  size_t len;
  char *p;
  char *lastsep;
  char *local_40;
  ulong local_30;
  char *local_28;
  char *local_20;
  
  local_20 = in_RDX;
  for (local_28 = in_RDX; *local_28 != '\0'; local_28 = local_28 + 1) {
    local_40 = local_28;
    if ((*local_28 == '/') ||
       ((*local_28 != '\0' && (pcVar1 = strchr("",(int)*local_28), pcVar1 != (char *)0x0)))) {
      do {
        local_40 = local_40 + 1;
        bVar2 = false;
        if ((*local_40 != '\0') &&
           ((bVar2 = true, *local_40 != '/' && (bVar2 = false, *local_40 != '\0')))) {
          pcVar1 = strchr("",(int)*local_40);
          bVar2 = pcVar1 != (char *)0x0;
        }
      } while (bVar2);
      if (*local_40 != '\0') {
        local_20 = local_28;
      }
    }
  }
  local_30 = (long)local_20 - (long)in_RDX;
  bVar2 = true;
  local_28 = in_RDX;
  do {
    if (local_28 == local_20) {
LAB_0010e4b7:
      if ((bVar2) &&
         ((in_RDX[local_30] == '/' ||
          ((in_RDX[local_30] != '\0' &&
           (pcVar1 = strchr("",(int)in_RDX[local_30]), pcVar1 != (char *)0x0)))))) {
        local_30 = local_30 + 1;
      }
      if (in_RSI - 1U < local_30) {
        local_30 = in_RSI - 1;
      }
      memcpy(in_RDI,in_RDX,local_30);
      *(undefined1 *)((long)in_RDI + local_30) = 0;
      return;
    }
    if ((*local_28 != '/') &&
       ((*local_28 == '\0' || (pcVar1 = strchr("",(int)*local_28), pcVar1 == (char *)0x0)))) {
      bVar2 = false;
      goto LAB_0010e4b7;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void os_get_path_name(char *pathbuf, size_t pathbuflen, const char *fname)
{
    const char *lastsep;
    const char *p;
    size_t len;
    int root_path;
    
#ifdef MSDOS
    /* 
     *   Special case for DOS/Windows: If we have a bare drive letter, or an
     *   explicit current directory path on a drive letter (X:.), there is no
     *   parent directory.  Our normal algorithm won't catch this because of
     *   our special handling that adds the working directory to a bare drive
     *   letter (turning "X:" into "X:.").
     */
    if (isalpha(fname[0]) && fname[1] == ':'
        && (fname[2] == '\0' || (fname[2] == '.' && fname[3] == '\0')))
    {
        if (pathbuflen > 0)
            pathbuf[0] = '\0';
        return;
    }
#endif

    /* find the last separator in the filename */
    for (p = fname, lastsep = fname ; *p != '\0' ; ++p)
    {
        /* 
         *   If it's a path separator character, remember it as the last one
         *   we've found so far.  However, don't count it if it's the last
         *   separator - i.e., if only more path separators follow.
         */
        if (ispathchar(*p))
        {
            const char *q;
            
            /* skip any immediately adjacent path separators */
            for (q = p + 1 ; *q != '\0' && ispathchar(*q) ; ++q) ;

            /* if we found more following, *p is the last separator */
            if (*q != '\0')
                lastsep = p;
        }
    }
    
    /* get the length of the prefix, not including the separator */
    len = lastsep - fname;
    
    /*
     *   Normally, we don't include the last path separator in the path; for
     *   example, on Unix, the path of "/a/b/c" is "/a/b", not "/a/b/".
     *   However, on Unix/DOS-like file systems, a root path *does* require
     *   the last path separator: the path of "/a" is "/", not an empty
     *   string.  So, we need to check to see if the file is in a root path,
     *   and if so, include the final path separator character in the path.  
     */
    for (p = fname, root_path = TRUE ; p != lastsep ; ++p)
    {
        /*
         *   if this is NOT a path separator character, we don't have all
         *   path separator characters before the filename, so we don't have
         *   a root path 
         */
        if (!ispathchar(*p))
        {
            /* note that we don't have a root path */
            root_path = FALSE;
            
            /* no need to look any further */
            break;
        }
    }

    /* if we have a root path, keep the final path separator in the path */
    if (root_path && ispathchar(fname[len]))
        ++len;

#ifdef MSDOS
    /*
     *   On DOS, we have a special case: if the path is of the form "x:\",
     *   where "x" is any letter, then we have a root filename and we want to
     *   include the backslash.  
     */
    if (lastsep == fname + 2
        && isalpha(fname[0]) && fname[1] == ':' && fname[2] == '\\')
    {
        /* we have an absolute path - use the full "x:\" sequence */
        len = 3;

        /* if this was the entire path name, we have no parent */
        if (fname[3] == '\0')
            len = 0;
    }

    /* if the path is of the form X:, keep the trailing colon */
    if (len == 1 && *lastsep == ':')
        len = 2;
#endif
    
    /* make sure it fits in our buffer (with a null terminator) */
    if (len > pathbuflen - 1)
        len = pathbuflen - 1;

    /* copy it and null-terminate it */
    memcpy(pathbuf, fname, len);
    pathbuf[len] = '\0';

#ifdef MSDOS
    /*
     *   Another DOS special case: if the path is of the form "X:", with no
     *   directory element, it refers to the current working directory on
     *   drive X: (DOS/Win keep a working directory per drive letter).  To
     *   make this more explicit, change it to "X:.", so that we actually
     *   have the name of a directory.  
     */
    if (lastsep == fname + 1 && pathbuf[1] == ':' && pathbuflen >= 4)
    {
        pathbuf[2] = '.';
        pathbuf[3] = '\0';
    }
#endif
}